

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thdat02.c
# Opt level: O0

ssize_t th02_read(thdat_t *thdat,int entry_index,thtk_io_t *output,thtk_error_t **error)

{
  thdat_entry_t *ptVar1;
  void *buf;
  ssize_t sVar2;
  thtk_io_t *input;
  thtk_io_t *data_stream;
  ssize_t i;
  ssize_t ret;
  uchar *data;
  thdat_entry_t *entry;
  thtk_error_t **error_local;
  thtk_io_t *output_local;
  int entry_index_local;
  thdat_t *thdat_local;
  
  ptVar1 = thdat->entries;
  buf = malloc(ptVar1[entry_index].zsize);
  sVar2 = thtk_io_pread(thdat->stream,buf,ptVar1[entry_index].zsize,ptVar1[entry_index].offset,error
                       );
  if (sVar2 == ptVar1[entry_index].zsize) {
    for (data_stream = (thtk_io_t *)0x0; (long)data_stream < ptVar1[entry_index].zsize;
        data_stream = (thtk_io_t *)((long)&data_stream->v + 1)) {
      *(byte *)((long)buf + (long)data_stream) =
           *(byte *)((long)buf + (long)data_stream) ^ (byte)ptVar1[entry_index].extra;
    }
    if (ptVar1[entry_index].size == ptVar1[entry_index].zsize) {
      i = thtk_io_write(output,buf,ptVar1[entry_index].zsize,error);
      free(buf);
    }
    else {
      input = thtk_io_open_memory(buf,ptVar1[entry_index].zsize,error);
      if (input == (thtk_io_t *)0x0) {
        return -1;
      }
      i = thtk_unrle(input,ptVar1[entry_index].zsize,output,error);
      thtk_io_close(input);
    }
    thdat_local = (thdat_t *)i;
  }
  else {
    free(buf);
    thdat_local = (thdat_t *)0xffffffffffffffff;
  }
  return (ssize_t)thdat_local;
}

Assistant:

static ssize_t
th02_read(
    thdat_t* thdat,
    int entry_index,
    thtk_io_t* output,
    thtk_error_t** error)
{
    thdat_entry_t* entry = &thdat->entries[entry_index];
    unsigned char* data = malloc(entry->zsize);
    ssize_t ret;

#pragma omp critical
    {
        ret = thtk_io_pread(thdat->stream, data, entry->zsize, entry->offset, error);
    }
    if (ret != (ssize_t)entry->zsize) {
        free(data);
        return -1;
    }

    for (ssize_t i = 0; i < entry->zsize; ++i)
        data[i] ^= entry->extra;

    if (entry->size == entry->zsize) {
        ret = thtk_io_write(output, data, entry->zsize, error);
        free(data);
    } else {
        thtk_io_t* data_stream = thtk_io_open_memory(data, entry->zsize, error);
        if (!data_stream)
            return -1;
        ret = thtk_unrle(data_stream, entry->zsize, output, error);
        thtk_io_close(data_stream);
    }

    return ret;
}